

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbytarr.cpp
# Opt level: O1

vm_obj_id_t CVmObjByteArray::create_from_bytes(int in_root_set,char *buf,size_t len)

{
  CVmObjPageEntry *pCVar1;
  vm_obj_id_t vVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong __n;
  
  vVar2 = create(in_root_set,len);
  if (len != 0) {
    pCVar1 = G_obj_table_X.pages_[vVar2 >> 0xc];
    lVar5 = 1;
    do {
      uVar3 = (uint)(lVar5 - 1U);
      uVar4 = (ulong)(uVar3 & 0x7fff);
      __n = 0x8000 - uVar4;
      if (len <= __n) {
        __n = len;
      }
      memcpy((void *)(uVar4 + *(long *)(*(long *)(*(long *)((long)&pCVar1[vVar2 & 0xfff].ptr_ + 8) +
                                                  4 + (lVar5 - 1U >> 0x1c) * 8) +
                                       (ulong)(uVar3 >> 0xc & 0xfff8))),buf,__n);
      buf = buf + __n;
      lVar5 = lVar5 + __n;
      len = len - __n;
    } while (len != 0);
  }
  return vVar2;
}

Assistant:

vm_obj_id_t CVmObjByteArray::create_from_bytes(
    VMG_ int in_root_set, const char *buf, size_t len)
{
    /* allocate the array */
    vm_obj_id_t id = create(vmg_ in_root_set, len);
    CVmObjByteArray *arr = (CVmObjByteArray *)vm_objp(vmg_ id);

    /* copy the bytes into the array */
    arr->cons_copy_from_buf((const unsigned char *)buf, 1, len);

    /* return the new array's object ID */
    return id;
}